

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_adj.c
# Opt level: O1

REF_STATUS ref_adj_add_uniquely(REF_ADJ ref_adj,REF_INT node,REF_INT reference)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  REF_STATUS RVar4;
  REF_INT *pRVar5;
  REF_ADJ_ITEM pRVar6;
  ulong uVar7;
  int iVar8;
  uint uVar9;
  undefined8 uVar10;
  REF_INT RVar11;
  long lVar12;
  long lVar13;
  
  uVar7 = 0xffffffff;
  if ((-1 < node) && (uVar7 = 0xffffffff, node < ref_adj->nnode)) {
    uVar7 = (ulong)(uint)ref_adj->first[(uint)node];
  }
  if ((int)uVar7 != -1) {
    iVar8 = ref_adj->item[(int)uVar7].ref;
    do {
      if (iVar8 == reference) {
        return 0;
      }
      iVar2 = ref_adj->item[(int)uVar7].next;
      uVar7 = (ulong)iVar2;
      if (uVar7 == 0xffffffffffffffff) {
        iVar8 = -1;
      }
      else {
        iVar8 = ref_adj->item[uVar7].ref;
      }
    } while (iVar2 != -1);
    RVar4 = ref_adj_add(ref_adj,node,reference);
    return RVar4;
  }
  if (node < 0) {
    return 3;
  }
  uVar1 = ref_adj->nnode;
  lVar13 = (long)(int)uVar1;
  if (node < (int)uVar1) {
LAB_001b4f0a:
    if (ref_adj->blank == -1) {
      uVar1 = ref_adj->nitem;
      lVar13 = (long)(int)uVar1;
      if (lVar13 == 0x7fffffff) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adj.c",0x81,
               "ref_adj_add","the number of ref_adj items is too large for int, cannot grow");
        return 1;
      }
      uVar9 = 100;
      if (100 < (int)((double)(int)uVar1 * 0.5)) {
        uVar9 = (int)((double)(int)uVar1 * 0.5);
      }
      uVar3 = uVar1 ^ 0x7fffffff;
      if ((int)uVar9 < (int)(uVar1 ^ 0x7fffffff)) {
        uVar3 = uVar9;
      }
      ref_adj->nitem = uVar3 + uVar1;
      fflush(_stdout);
      if (0 < (long)ref_adj->nitem) {
        pRVar6 = (REF_ADJ_ITEM)realloc(ref_adj->item,(long)ref_adj->nitem << 3);
        ref_adj->item = pRVar6;
      }
      pRVar6 = ref_adj->item;
      if (pRVar6 == (REF_ADJ_ITEM)0x0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adj.c",0x88,
               "ref_adj_add","realloc ref_adj->item NULL");
        uVar7 = (ulong)ref_adj->nitem;
        lVar13 = uVar7 * 8;
        uVar10 = 8;
        goto LAB_001b50c0;
      }
      iVar8 = ref_adj->nitem;
      if ((int)uVar1 < iVar8) {
        lVar12 = 0;
        do {
          pRVar6[lVar13 + lVar12].ref = -1;
          pRVar6[lVar13 + lVar12].next = uVar1 + 1 + (int)lVar12;
          lVar12 = lVar12 + 1;
        } while (iVar8 - lVar13 != lVar12);
      }
      pRVar6[(long)iVar8 + -1].next = -1;
      ref_adj->blank = uVar1;
    }
    iVar8 = ref_adj->blank;
    pRVar6 = ref_adj->item;
    ref_adj->blank = pRVar6[iVar8].next;
    pRVar6[iVar8].ref = reference;
    RVar11 = -1;
    if (node < ref_adj->nnode) {
      RVar11 = ref_adj->first[(uint)node];
    }
    pRVar6[iVar8].next = RVar11;
    ref_adj->first[(uint)node] = iVar8;
    RVar4 = 0;
  }
  else {
    iVar8 = 0;
    if (0 < (int)(node - uVar1)) {
      iVar8 = node - uVar1;
    }
    uVar9 = iVar8 + 100U;
    if ((int)(iVar8 + 100U) <= (int)((double)(int)uVar1 * 0.5)) {
      uVar9 = (int)((double)(int)uVar1 * 0.5);
    }
    uVar3 = uVar1 ^ 0x7fffffff;
    if ((int)uVar9 < (int)(uVar1 ^ 0x7fffffff)) {
      uVar3 = uVar9;
    }
    ref_adj->nnode = uVar3 + uVar1;
    fflush(_stdout);
    if (0 < (long)ref_adj->nnode) {
      pRVar5 = (REF_INT *)realloc(ref_adj->first,(long)ref_adj->nnode << 2);
      ref_adj->first = pRVar5;
    }
    pRVar5 = ref_adj->first;
    if (pRVar5 != (REF_INT *)0x0) {
      if ((int)uVar1 < ref_adj->nnode) {
        do {
          pRVar5[lVar13] = -1;
          lVar13 = lVar13 + 1;
        } while (lVar13 < ref_adj->nnode);
      }
      goto LAB_001b4f0a;
    }
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adj.c",0x7a,
           "ref_adj_add","realloc ref_adj->first NULL");
    uVar7 = (ulong)ref_adj->nnode;
    lVar13 = uVar7 * 4;
    uVar10 = 4;
LAB_001b50c0:
    printf("failed to realloc n int %d uLong %lu size_of %lu = %lu\n",uVar7 & 0xffffffff,uVar7,
           uVar10,lVar13);
    RVar4 = 2;
  }
  return RVar4;
}

Assistant:

REF_FCN REF_STATUS ref_adj_add_uniquely(REF_ADJ ref_adj, REF_INT node,
                                        REF_INT reference) {
  REF_INT item, ref;

  each_ref_adj_node_item_with_ref(ref_adj, node, item, ref) {
    if (ref == reference) {
      return REF_SUCCESS;
    }
  }

  return ref_adj_add(ref_adj, node, reference);
}